

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Maybe<capnp::compiler::NodeTranslator::BrandedDecl> * __thiscall
capnp::compiler::NodeTranslator::BrandScope::compileDeclExpression
          (Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *__return_storage_ptr__,
          BrandScope *this,Reader source,Resolver *resolver,ImplicitParams implicitMethodParams)

{
  Reader *__return_storage_ptr___00;
  int *piVar1;
  ErrorReporter *pEVar2;
  Reader source_00;
  Reader source_01;
  Reader RVar3;
  Reader name_00;
  undefined2 uVar4;
  bool bVar5;
  bool bVar6;
  Which WVar7;
  uint uVar8;
  unsigned_long *puVar9;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *pNVar10;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  *pOVar11;
  NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *other;
  ResolvedDecl *pRVar12;
  ResolvedDecl *pRVar13;
  ResolvedDecl *pRVar14;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *pNVar15;
  BrandedDecl *pBVar16;
  Reader *params_1;
  ResolvedParameter variable;
  Reader RVar17;
  Iterator IVar18;
  uint64_t uVar19;
  ArrayPtr<const_char> local_14c8;
  Reader local_14b8;
  String local_1488;
  String local_1470;
  ArrayPtr<const_char> local_1458;
  SegmentReader *local_1448;
  CapTableReader *pCStack_1440;
  void *local_1438;
  WirePointer *pWStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  ArrayPtr<const_char> local_1418;
  ArrayPtr<const_char> local_1408;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_13f8;
  undefined1 local_1348 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> memberDecl;
  Reader name_2;
  Reader local_1228;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_11f8;
  undefined1 local_1148 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl_2;
  Reader member;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_1030;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_1018;
  undefined1 local_f68 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> applied;
  Reader local_e78;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_e48;
  undefined1 local_d98 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> d;
  Reader local_cd8;
  undefined1 local_ca8 [8];
  Reader param;
  undefined1 local_c68 [8];
  Iterator __end4;
  undefined1 local_c48 [8];
  Iterator __begin4;
  Reader *__range4;
  undefined1 local_c28 [7];
  bool paramFailed;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> compiledParams;
  Reader params;
  Reader local_ba0;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_b70;
  undefined1 local_ac0 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl_1;
  Reader app;
  String local_9d0;
  ArrayPtr<const_char> local_9b8;
  SegmentReader *local_9a8;
  CapTableReader *pCStack_9a0;
  void *local_998;
  WirePointer *pWStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_970;
  ResolvedDecl local_960;
  BrandedDecl local_900;
  ArrayPtr<const_char> local_858;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> local_830;
  undefined1 local_7c8 [8];
  NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> decl;
  Reader filename;
  String local_720;
  ArrayPtr<const_char> local_708;
  SegmentReader *local_6f8;
  CapTableReader *pCStack_6f0;
  void *local_6e8;
  WirePointer *pWStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  BrandedDecl local_6c0;
  ArrayPtr<const_char> local_618;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  ResolvedDecl local_5f8;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_598;
  undefined1 local_528 [8];
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  r_1;
  Reader name_1;
  ArrayPtr<const_char> local_470;
  undefined4 local_45c;
  SegmentReader *local_458;
  CapTableReader *pCStack_450;
  void *local_448;
  WirePointer *pWStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  BrandedDecl local_420;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_368;
  undefined1 local_2f8 [8];
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  r;
  BrandedDecl local_240;
  BrandedDecl local_188;
  Reader local_e0;
  ArrayPtr<const_char> local_b0;
  unsigned_long local_a0;
  unsigned_long i;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_long> *__range3;
  Reader nameValue;
  Reader name;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  WVar7 = Expression::Reader::which(&source);
  switch(WVar7) {
  case UNKNOWN:
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
              (__return_storage_ptr__,(void *)0x0);
    break;
  case POSITIVE_INT:
  case NEGATIVE_INT:
  case FLOAT:
  case STRING:
  case LIST:
  case TUPLE:
  case BINARY:
  case EMBED:
    pEVar2 = this->errorReporter;
    kj::StringPtr::StringPtr((StringPtr *)&name._reader.nestingLimit,"Expected name.");
    ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
              (pEVar2,&source,(StringPtr)stack0xffffffffffffffd0);
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
              (__return_storage_ptr__,(void *)0x0);
    break;
  case RELATIVE_NAME:
    Expression::Reader::getRelativeName((Reader *)&nameValue.super_StringPtr.content.size_,&source);
    ___range3 = (ArrayPtr<const_char>)
                LocatedText::Reader::getValue((Reader *)&nameValue.super_StringPtr.content.size_);
    ___begin3 = kj::
                indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                          (&implicitMethodParams.params);
    __end3 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin3);
    i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin3);
    while (bVar5 = kj::Range<unsigned_long>::Iterator::operator!=(&__end3,(Iterator *)&i), bVar5) {
      puVar9 = kj::Range<unsigned_long>::Iterator::operator*(&__end3);
      local_a0 = *puVar9;
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                (&local_e0,&implicitMethodParams.params,(uint)local_a0);
      local_b0 = (ArrayPtr<const_char>)Declaration::BrandParameter::Reader::getName(&local_e0);
      bVar5 = kj::StringPtr::operator==((StringPtr *)&local_b0,(StringPtr *)&__range3);
      if (bVar5) {
        uVar19 = implicitMethodParams.scopeId;
        if (implicitMethodParams.scopeId == 0) {
          BrandedDecl::implicitMethodParam(&local_188,(uint)local_a0);
          kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                    (__return_storage_ptr__,&local_188);
          BrandedDecl::~BrandedDecl(&local_188);
          return __return_storage_ptr__;
        }
        uVar4 = (undefined2)local_a0;
        r.field_1._96_8_ = 0;
        Expression::Reader::Reader((Reader *)((long)&r.field_1 + 0x60));
        variable.index._0_2_ = uVar4;
        variable.id = uVar19;
        variable._10_6_ = 0;
        BrandedDecl::BrandedDecl(&local_240,variable,(Reader)ZEXT848((ulong)r.field_1._96_8_));
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                  (__return_storage_ptr__,&local_240);
        BrandedDecl::~BrandedDecl(&local_240);
        return __return_storage_ptr__;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end3);
    }
    local_378 = __range3._0_4_;
    uStack_374 = __range3._4_4_;
    uStack_370 = nameValue.super_StringPtr.content.ptr._0_4_;
    uStack_36c = nameValue.super_StringPtr.content.ptr._4_4_;
    params_1 = (Reader *)__range3._8_8_;
    (**resolver->_vptr_Resolver)(&local_368,resolver,__range3);
    pNVar10 = kj::_::
              readMaybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>>
                        (&local_368);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)local_2f8,pNVar10);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_368);
    pOVar11 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_2f8);
    if (pOVar11 ==
        (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
         *)0x0) {
      pEVar2 = this->errorReporter;
      kj::str<char_const(&)[14],capnp::Text::Reader&>
                ((String *)&name_1._reader.nestingLimit,(kj *)"Not defined: ",
                 (char (*) [14])&__range3,params_1);
      kj::StringPtr::StringPtr((StringPtr *)&local_470,(String *)&name_1._reader.nestingLimit);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)&nameValue.super_StringPtr.content.size_,(StringPtr)local_470);
      kj::String::~String((String *)&name_1._reader.nestingLimit);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
    else {
      pOVar11 = kj::_::
                NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                ::operator*((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                             *)local_2f8);
      RVar3 = source;
      local_458 = source._reader.segment;
      pCStack_450 = source._reader.capTable;
      local_448 = source._reader.data;
      pWStack_440 = source._reader.pointers;
      local_438._0_4_ = source._reader.dataSize;
      local_438._4_2_ = source._reader.pointerCount;
      local_438._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_430._0_4_ = source._reader.nestingLimit;
      uStack_430._4_4_ = source._reader._44_4_;
      source = RVar3;
      interpretResolve(&local_420,this,resolver,pOVar11,RVar3);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,&local_420);
      BrandedDecl::~BrandedDecl(&local_420);
    }
    local_45c = 1;
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                      *)local_2f8);
    break;
  case APPLICATION:
    piVar1 = &decl_1.field_1.value.source._reader.nestingLimit;
    Expression::Reader::getApplication((Reader *)piVar1,&source);
    Expression::Application::Reader::getFunction(&local_ba0,(Reader *)piVar1);
    source_00._reader.capTable = local_ba0._reader.capTable;
    source_00._reader.segment = local_ba0._reader.segment;
    source_00._reader.data = local_ba0._reader.data;
    source_00._reader.pointers = local_ba0._reader.pointers;
    source_00._reader.dataSize = local_ba0._reader.dataSize;
    source_00._reader.pointerCount = local_ba0._reader.pointerCount;
    source_00._reader._38_2_ = local_ba0._reader._38_2_;
    source_00._reader.nestingLimit = local_ba0._reader.nestingLimit;
    source_00._reader._44_4_ = local_ba0._reader._44_4_;
    compileDeclExpression(&local_b70,this,source_00,resolver,implicitMethodParams);
    pNVar15 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_b70);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_ac0,pNVar15);
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_b70);
    pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_ac0);
    if (pBVar16 == (BrandedDecl *)0x0) {
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
      local_45c = 1;
    }
    else {
      Expression::Application::Reader::getParams
                ((Reader *)&compiledParams.disposer,
                 (Reader *)&decl_1.field_1.value.source._reader.nestingLimit);
      uVar8 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::size
                        ((Reader *)&compiledParams.disposer);
      kj::heapArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>
                ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c28,
                 (ulong)uVar8);
      bVar5 = false;
      __begin4._8_8_ = &compiledParams.disposer;
      IVar18 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                         ((Reader *)__begin4._8_8_);
      __end4._8_8_ = IVar18.container;
      __begin4.container._0_4_ = IVar18.index;
      local_c48 = (undefined1  [8])__end4._8_8_;
      IVar18 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end
                         ((Reader *)__begin4._8_8_);
      param._reader._40_8_ = IVar18.container;
      __end4.container._0_4_ = IVar18.index;
      local_c68 = (undefined1  [8])param._reader._40_8_;
      while (bVar6 = capnp::_::
                     IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                     ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                   *)local_c48,
                                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                   *)local_c68), bVar6) {
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator*((Reader *)local_ca8,
                    (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                     *)local_c48);
        bVar6 = Expression::Param::Reader::isNamed((Reader *)local_ca8);
        if (bVar6) {
          pEVar2 = this->errorReporter;
          Expression::Param::Reader::getNamed(&local_cd8,(Reader *)local_ca8);
          kj::StringPtr::StringPtr
                    ((StringPtr *)&d.field_1.value.source._reader.nestingLimit,
                     "Named parameter not allowed here.");
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader>
                    (pEVar2,&local_cd8,(StringPtr)stack0xfffffffffffff318);
        }
        Expression::Param::Reader::getValue(&local_e78,(Reader *)local_ca8);
        applied.field_1._160_8_ = implicitMethodParams.scopeId;
        source_01._reader.capTable = local_e78._reader.capTable;
        source_01._reader.segment = local_e78._reader.segment;
        source_01._reader.data = local_e78._reader.data;
        source_01._reader.pointers = local_e78._reader.pointers;
        source_01._reader.dataSize = local_e78._reader.dataSize;
        source_01._reader.pointerCount = local_e78._reader.pointerCount;
        source_01._reader._38_2_ = local_e78._reader._38_2_;
        source_01._reader.nestingLimit = local_e78._reader.nestingLimit;
        source_01._reader._44_4_ = local_e78._reader._44_4_;
        compileDeclExpression(&local_e48,this,source_01,resolver,implicitMethodParams);
        pNVar15 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_e48);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_d98,pNVar15)
        ;
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_e48);
        pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_d98);
        if (pBVar16 == (BrandedDecl *)0x0) {
          bVar5 = true;
        }
        else {
          pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                               local_d98);
          pBVar16 = kj::mv<capnp::compiler::NodeTranslator::BrandedDecl>(pBVar16);
          kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::
          add<capnp::compiler::NodeTranslator::BrandedDecl>
                    ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c28,pBVar16
                    );
        }
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_d98);
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
        ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                      *)local_c48);
      }
      if (bVar5) {
        pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                             local_ac0);
        pBVar16 = kj::mv<capnp::compiler::NodeTranslator::BrandedDecl>(pBVar16);
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                  (__return_storage_ptr__,pBVar16);
        local_45c = 1;
      }
      else {
        pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                             local_ac0);
        kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::finish
                  (&local_1030,
                   (ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c28);
        BrandedDecl::applyParams(&local_1018,pBVar16,&local_1030,source);
        pNVar15 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_1018);
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_f68,pNVar15)
        ;
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_1018);
        kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array(&local_1030);
        pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_f68);
        if (pBVar16 == (BrandedDecl *)0x0) {
          pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                               local_ac0);
          pBVar16 = kj::mv<capnp::compiler::NodeTranslator::BrandedDecl>(pBVar16);
          kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                    (__return_storage_ptr__,pBVar16);
        }
        else {
          pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                               local_f68);
          pBVar16 = kj::mv<capnp::compiler::NodeTranslator::BrandedDecl>(pBVar16);
          kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                    (__return_storage_ptr__,pBVar16);
        }
        local_45c = 1;
        kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                  ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_f68);
      }
      kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl>::~ArrayBuilder
                ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c28);
    }
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_ac0);
    break;
  case MEMBER:
    piVar1 = &decl_2.field_1.value.source._reader.nestingLimit;
    Expression::Reader::getMember((Reader *)piVar1,&source);
    Expression::Member::Reader::getParent(&local_1228,(Reader *)piVar1);
    RVar3._reader.capTable = local_1228._reader.capTable;
    RVar3._reader.segment = local_1228._reader.segment;
    RVar3._reader.data = local_1228._reader.data;
    RVar3._reader.pointers = local_1228._reader.pointers;
    RVar3._reader.dataSize = local_1228._reader.dataSize;
    RVar3._reader.pointerCount = local_1228._reader.pointerCount;
    RVar3._reader._38_2_ = local_1228._reader._38_2_;
    RVar3._reader.nestingLimit = local_1228._reader.nestingLimit;
    RVar3._reader._44_4_ = local_1228._reader._44_4_;
    uVar19 = implicitMethodParams.scopeId;
    compileDeclExpression(&local_11f8,this,RVar3,resolver,implicitMethodParams);
    pNVar15 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_11f8);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1148,pNVar15);
    kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_11f8);
    pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1148);
    if (pBVar16 == (BrandedDecl *)0x0) {
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
      local_45c = 1;
    }
    else {
      Expression::Member::Reader::getName
                ((Reader *)&memberDecl.field_1.value.source._reader.nestingLimit,
                 (Reader *)&decl_2.field_1.value.source._reader.nestingLimit);
      pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                          ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1148
                          );
      local_1418 = (ArrayPtr<const_char>)
                   LocatedText::Reader::getValue
                             ((Reader *)&memberDecl.field_1.value.source._reader.nestingLimit);
      RVar3 = source;
      local_1448 = source._reader.segment;
      pCStack_1440 = source._reader.capTable;
      local_1438 = source._reader.data;
      pWStack_1430 = source._reader.pointers;
      local_1428._0_4_ = source._reader.dataSize;
      local_1428._4_2_ = source._reader.pointerCount;
      local_1428._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_1420._0_4_ = source._reader.nestingLimit;
      uStack_1420._4_4_ = source._reader._44_4_;
      source = RVar3;
      local_1408 = local_1418;
      BrandedDecl::getMember(&local_13f8,pBVar16,(StringPtr)local_1418,RVar3);
      pNVar15 = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_13f8);
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1348,pNVar15);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_13f8);
      pBVar16 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1348);
      if (pBVar16 == (BrandedDecl *)0x0) {
        pEVar2 = this->errorReporter;
        Expression::Member::Reader::getParent
                  (&local_14b8,(Reader *)&decl_2.field_1.value.source._reader.nestingLimit);
        name_00._reader.capTable = (CapTableReader *)local_14b8._reader.data;
        name_00._reader.segment = (SegmentReader *)local_14b8._reader.capTable;
        name_00._reader.data = local_14b8._reader.pointers;
        name_00._reader.pointers = (WirePointer *)local_14b8._reader._32_8_;
        name_00._reader.dataSize = local_14b8._reader.nestingLimit;
        name_00._reader.pointerCount = local_14b8._reader._44_2_;
        name_00._reader._38_2_ = local_14b8._reader._46_2_;
        name_00._reader._40_8_ = uVar19;
        expressionString(name_00);
        local_14c8 = (ArrayPtr<const_char>)
                     LocatedText::Reader::getValue
                               ((Reader *)&memberDecl.field_1.value.source._reader.nestingLimit);
        kj::str<char_const(&)[2],kj::String,char_const(&)[24],capnp::Text::Reader,char_const(&)[2]>
                  (&local_1470,(kj *)0x538fb3,(char (*) [2])&local_1488,
                   (String *)"\' has no member named \'",(char (*) [24])&local_14c8,
                   (Reader *)0x538fb3,(char (*) [2])local_14b8._reader.segment);
        kj::StringPtr::StringPtr((StringPtr *)&local_1458,&local_1470);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,(Reader *)&memberDecl.field_1.value.source._reader.nestingLimit,
                   (StringPtr)local_1458);
        kj::String::~String(&local_1470);
        kj::String::~String(&local_1488);
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                  (__return_storage_ptr__,(void *)0x0);
      }
      else {
        pBVar16 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator*
                            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)
                             local_1348);
        pBVar16 = kj::mv<capnp::compiler::NodeTranslator::BrandedDecl>(pBVar16);
        kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                  (__return_storage_ptr__,pBVar16);
      }
      local_45c = 1;
      kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1348);
    }
    kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_1148);
    break;
  case ABSOLUTE_NAME:
    __return_storage_ptr___00 = (Reader *)((long)&r_1.field_1 + 0x60);
    Expression::Reader::getAbsoluteName(__return_storage_ptr___00,&source);
    (*resolver->_vptr_Resolver[5])(&local_5f8);
    local_618 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(__return_storage_ptr___00);
    local_608 = local_618.ptr._0_4_;
    uStack_604 = local_618.ptr._4_4_;
    uStack_600 = (undefined4)local_618.size_;
    uStack_5fc = local_618.size_._4_4_;
    (*(local_5f8.resolver)->_vptr_Resolver[1])
              (&local_598,local_5f8.resolver,local_618.ptr,local_618.size_);
    pNVar10 = kj::_::
              readMaybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>>
                        (&local_598);
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)local_528,pNVar10);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_598);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_5f8);
    pOVar11 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_528);
    if (pOVar11 ==
        (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
         *)0x0) {
      pEVar2 = this->errorReporter;
      RVar17 = LocatedText::Reader::getValue((Reader *)((long)&r_1.field_1 + 0x60));
      filename._reader._40_8_ = RVar17.super_StringPtr.content.ptr;
      kj::str<char_const(&)[14],capnp::Text::Reader>
                (&local_720,(kj *)"Not defined: ",(char (*) [14])&filename._reader.nestingLimit,
                 (Reader *)filename._reader._40_8_);
      kj::StringPtr::StringPtr((StringPtr *)&local_708,&local_720);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)((long)&r_1.field_1 + 0x60),(StringPtr)local_708);
      kj::String::~String(&local_720);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
    else {
      pOVar11 = kj::_::
                NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                ::operator*((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                             *)local_528);
      RVar3 = source;
      local_6f8 = source._reader.segment;
      pCStack_6f0 = source._reader.capTable;
      local_6e8 = source._reader.data;
      pWStack_6e0 = source._reader.pointers;
      local_6d8._0_4_ = source._reader.dataSize;
      local_6d8._4_2_ = source._reader.pointerCount;
      local_6d8._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_6d0._0_4_ = source._reader.nestingLimit;
      uStack_6d0._4_4_ = source._reader._44_4_;
      source = RVar3;
      interpretResolve(&local_6c0,this,resolver,pOVar11,RVar3);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,&local_6c0);
      BrandedDecl::~BrandedDecl(&local_6c0);
    }
    local_45c = 1;
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                      *)local_528);
    break;
  case IMPORT:
    piVar1 = &decl.field_1.value.brand.ptr.field_1.value._reader.nestingLimit;
    Expression::Reader::getImport((Reader *)piVar1,&source);
    local_858 = (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)piVar1);
    local_848 = local_858.ptr._0_4_;
    uStack_844 = local_858.ptr._4_4_;
    uStack_840 = (undefined4)local_858.size_;
    uStack_83c = local_858.size_._4_4_;
    (*resolver->_vptr_Resolver[8])(&local_830,resolver,local_858.ptr,local_858.size_);
    other = kj::_::readMaybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&local_830);
    kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)local_7c8,
               other);
    kj::Maybe<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::~Maybe(&local_830);
    pRVar12 = kj::_::NullableValue::operator_cast_to_ResolvedDecl_((NullableValue *)local_7c8);
    if (pRVar12 == (ResolvedDecl *)0x0) {
      pEVar2 = this->errorReporter;
      RVar17 = LocatedText::Reader::getValue
                         ((Reader *)&decl.field_1.value.brand.ptr.field_1.value._reader.nestingLimit
                         );
      app._reader._40_8_ = RVar17.super_StringPtr.content.ptr;
      kj::str<char_const(&)[16],capnp::Text::Reader>
                (&local_9d0,(kj *)"Import failed: ",(char (*) [16])&app._reader.nestingLimit,
                 (Reader *)app._reader._40_8_);
      kj::StringPtr::StringPtr((StringPtr *)&local_9b8,&local_9d0);
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)&decl.field_1.value.brand.ptr.field_1.value._reader.nestingLimit,
                 (StringPtr)local_9b8);
      kj::String::~String(&local_9d0);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,(void *)0x0);
    }
    else {
      pRVar12 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
                operator*((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)
                          local_7c8);
      Resolver::ResolvedDecl::ResolvedDecl(&local_960,pRVar12);
      pEVar2 = this->errorReporter;
      pRVar12 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
                operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *
                           )local_7c8);
      pRVar13 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
                operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *
                           )local_7c8);
      pRVar14 = kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::
                operator->((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *
                           )local_7c8);
      kj::
      refcounted<capnp::compiler::NodeTranslator::BrandScope,capnp::compiler::ErrorReporter&,unsigned_long&,unsigned_int&,capnp::compiler::NodeTranslator::Resolver&>
                ((kj *)&local_970,pEVar2,&pRVar12->id,&pRVar13->genericParamCount,pRVar14->resolver)
      ;
      RVar3 = source;
      local_9a8 = source._reader.segment;
      pCStack_9a0 = source._reader.capTable;
      local_998 = source._reader.data;
      pWStack_990 = source._reader.pointers;
      local_988._0_4_ = source._reader.dataSize;
      local_988._4_2_ = source._reader.pointerCount;
      local_988._6_2_ = source._reader._38_2_;
      source._reader._40_8_ = RVar3._reader._40_8_;
      uStack_980._0_4_ = source._reader.nestingLimit;
      uStack_980._4_4_ = source._reader._44_4_;
      source = RVar3;
      BrandedDecl::BrandedDecl(&local_900,&local_960,&local_970,RVar3);
      kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::Maybe
                (__return_storage_ptr__,&local_900);
      BrandedDecl::~BrandedDecl(&local_900);
      kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own(&local_970);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_960);
    }
    local_45c = 1;
    kj::_::NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl> *)local_7c8);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::BrandedDecl> NodeTranslator::BrandScope::compileDeclExpression(
    Expression::Reader source, Resolver& resolver,
    ImplicitParams implicitMethodParams) {
  switch (source.which()) {
    case Expression::UNKNOWN:
      // Error reported earlier.
      return nullptr;

    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::LIST:
    case Expression::TUPLE:
    case Expression::EMBED:
      errorReporter.addErrorOn(source, "Expected name.");
      return nullptr;

    case Expression::RELATIVE_NAME: {
      auto name = source.getRelativeName();
      auto nameValue = name.getValue();

      // Check implicit method params first.
      for (auto i: kj::indices(implicitMethodParams.params)) {
        if (implicitMethodParams.params[i].getName() == nameValue) {
          if (implicitMethodParams.scopeId == 0) {
            return BrandedDecl::implicitMethodParam(i);
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {
                implicitMethodParams.scopeId, static_cast<uint16_t>(i) },
                Expression::Reader());
          }
        }
      }

      KJ_IF_MAYBE(r, resolver.resolve(nameValue)) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", nameValue));
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME: {
      auto name = source.getAbsoluteName();
      KJ_IF_MAYBE(r, resolver.getTopScope().resolver->resolveMember(name.getValue())) {
        return interpretResolve(resolver, *r, source);
      } else {
        errorReporter.addErrorOn(name, kj::str("Not defined: ", name.getValue()));
        return nullptr;
      }
    }